

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds04_playlist.cpp
# Opt level: O2

void __thiscall
CP::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::check
          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  int iVar1;
  ostream *poVar2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *plVar3;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *plVar4;
  int iVar5;
  bool bVar6;
  
  iVar1 = (int)this->mSize + 1;
  plVar3 = this;
  iVar5 = iVar1;
  while( true ) {
    bVar6 = iVar5 == 0;
    iVar5 = iVar5 + -1;
    if (bVar6) break;
    plVar3 = (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&plVar3->mHeader->next;
  }
  plVar4 = this;
  if (plVar3->mHeader != this->mHeader) {
    poVar2 = std::operator<<((ostream *)&std::cout,"next POINTER ERROR");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = (int)this->mSize + 1;
  }
  while( true ) {
    bVar6 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar6) break;
    plVar4 = (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&plVar4->mHeader->prev;
  }
  if (plVar4->mHeader == this->mHeader) {
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"prev POINTER ERROR");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void check() {
      node* p;
      int n;
      p = mHeader;
      n = mSize+1;
      while (n--) p = p->next;
      if (p != mHeader) {
        std::cout << "next POINTER ERROR" << std::endl;
      }
      p = mHeader;
      n = mSize+1;
      while (n--) p = p->prev;
      if (p != mHeader) {
        std::cout << "prev POINTER ERROR" << std::endl;
      }
    }